

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O2

int __thiscall QFile::open(QFile *this,char *__file,int __oflag,...)

{
  QFilePrivate *this_00;
  bool bVar1;
  int iVar2;
  __off64_t pos;
  FileHandleFlags in_ECX;
  int __oflag_00;
  char *__file_00;
  int iVar3;
  long in_FS_OFFSET;
  QMessageLogger local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QFilePrivate *)(this->super_QFileDevice).super_QIODevice.super_QObject.d_ptr.d;
  bVar1 = QIODevice::isOpen((QIODevice *)this);
  if (bVar1) {
    iVar3 = 0;
    file_already_open(this,(char *)0x0);
  }
  else {
    __file_00 = (char *)(ulong)(__oflag | 2);
    if ((__oflag & 0x44U) == 0) {
      __file_00 = (char *)(ulong)(uint)__oflag;
    }
    QFileDevice::unsetError(&this->super_QFileDevice);
    if (((ulong)__file_00 & 3) == 0) {
      local_58.context.version = 2;
      local_58.context.function._4_4_ = 0;
      local_58.context._4_8_ = 0;
      local_58.context._12_8_ = 0;
      local_58.context.category = "default";
      iVar3 = 0;
      QMessageLogger::warning(&local_58,"QFile::open: File access not specified");
    }
    else {
      bVar1 = QFilePrivate::openExternalFile
                        (this_00,(OpenMode)((uint)__file_00 | 0x20),(FILE *)__file,in_ECX);
      if (bVar1) {
        QIODevice::open((QIODevice *)this,__file_00,__oflag_00);
        iVar3 = (int)CONCAT71((int7)((ulong)this_00 >> 8),1);
        if (((ulong)__file_00 & 4) == 0) {
          iVar2 = (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xc])
                            (this);
          if ((char)iVar2 == '\0') {
            pos = ftello64((FILE *)__file);
            if (pos != -1) {
              QIODevice::seek((QIODevice *)this,pos);
            }
          }
        }
      }
      else {
        iVar3 = 0;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QFile::open(FILE *fh, OpenMode mode, FileHandleFlags handleFlags)
{
    Q_D(QFile);
    if (isOpen())
        return file_already_open(*this);
    // Either Append or NewOnly implies WriteOnly
    if (mode & (Append | NewOnly))
        mode |= WriteOnly;
    unsetError();
    if ((mode & (ReadOnly | WriteOnly)) == 0) {
        qWarning("QFile::open: File access not specified");
        return false;
    }

    // QIODevice provides the buffering, so request unbuffered file engines
    if (d->openExternalFile(mode | Unbuffered, fh, handleFlags)) {
        QIODevice::open(mode);
        if (!(mode & Append) && !isSequential()) {
            qint64 pos = (qint64)QT_FTELL(fh);
            if (pos != -1) {
                // Skip redundant checks in QFileDevice::seek().
                QIODevice::seek(pos);
            }
        }
        return true;
    }
    return false;
}